

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainClient.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Client *this;
  thread thr_recv;
  thread thr_send;
  Client *client;
  thread local_58;
  thread local_50;
  Client *local_48;
  string local_40;
  Client **local_20;
  
  this = (Client *)operator_new(0x90);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"127.0.0.1","");
  Client::Client(this,&local_40,0x15c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_48 = this;
  (**(this->super_TCP)._vptr_TCP)(this);
  local_58._M_id._M_thread = (id)(id)&local_48;
  std::thread::thread<void(&)(Client**),Client**,void>
            (&local_50,SendMsgHandler,(Client ***)&local_58);
  local_20 = &local_48;
  std::thread::thread<void(&)(Client**),Client**,void>(&local_58,ReceiveMsgHandler,&local_20);
  std::thread::join();
  std::thread::join();
  (*(local_48->super_TCP)._vptr_TCP[3])();
  if ((local_58._M_id._M_thread == 0) && (local_50._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char *argv[])
{
    Client *client = new Client("127.0.0.1", 5576);
    client->Connect();

    std::thread thr_send = std::thread(SendMsgHandler, &client);
    std::thread thr_recv = std::thread(ReceiveMsgHandler, &client);

    thr_send.join();
    thr_recv.join();

    client->Close();

    return 0;
}